

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

int Kit_DsdRootNodeHasCommonVars(Kit_DsdObj_t *pObj0,Kit_DsdObj_t *pObj1)

{
  ulong uVar1;
  ulong uVar2;
  
  if (0x3ffffff < (uint)*pObj0) {
    uVar1 = 0;
    do {
      if ((*(ushort *)(&pObj0[1].field_0x0 + uVar1 * 2) < 8) && (0x3ffffff < (uint)*pObj1)) {
        uVar2 = 0;
        do {
          if ((*(ushort *)(&pObj1[1].field_0x0 + uVar2 * 2) ^
              *(ushort *)(&pObj0[1].field_0x0 + uVar1 * 2)) < 2) {
            return 1;
          }
          uVar2 = uVar2 + 1;
        } while ((uint)*pObj1 >> 0x1a != uVar2);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != (uint)*pObj0 >> 0x1a);
  }
  return 0;
}

Assistant:

int Kit_DsdRootNodeHasCommonVars( Kit_DsdObj_t * pObj0, Kit_DsdObj_t * pObj1 )
{
    unsigned i, k;
    for ( i = 0; i < pObj0->nFans; i++ )
    {
        if ( Abc_Lit2Var(pObj0->pFans[i]) >= 4 )
            continue;
        for ( k = 0; k < pObj1->nFans; k++ )
            if ( Abc_Lit2Var(pObj0->pFans[i]) == Abc_Lit2Var(pObj1->pFans[k]) )
                return 1;
    }
    return 0;
}